

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> * __thiscall
glslang::TIntermediate::
addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
          (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           *__return_storage_ptr__,TIntermediate *this,
          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name)

{
  char *__s;
  pointer pcVar1;
  TPoolAllocator *pTVar2;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  
  __s = this->implicitCounterName;
  pTVar2 = GetThreadPoolAllocator();
  (__return_storage_ptr__->_M_dataplus).super_allocator_type.allocator = pTVar2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      __return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (__return_storage_ptr__,__s);
  return __return_storage_ptr__;
}

Assistant:

bool hasCounterBufferName(const TString& name) const {
        size_t len = strlen(implicitCounterName);
        return name.size() > len &&
               name.compare(name.size() - len, len, implicitCounterName) == 0;
    }